

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_common_int.h
# Opt level: O0

void set_mi_row_col(MACROBLOCKD *xd,TileInfo *tile,int mi_row,int bh,int mi_col,int bw,int mi_rows,
                   int mi_cols)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  bool bVar4;
  MB_MODE_INFO *local_60;
  MB_MODE_INFO *local_58;
  MB_MODE_INFO *chroma_left_mi;
  MB_MODE_INFO *chroma_above_mi;
  MB_MODE_INFO **base_mi;
  int chroma_ref;
  int ss_y;
  int ss_x;
  int bw_local;
  int mi_col_local;
  int bh_local;
  int mi_row_local;
  TileInfo *tile_local;
  MACROBLOCKD *xd_local;
  
  xd->mb_to_top_edge = mi_row * -0x20;
  xd->mb_to_bottom_edge = ((mi_rows - bh) - mi_row) * 0x20;
  xd->mb_to_left_edge = mi_col * -0x20;
  xd->mb_to_right_edge = ((mi_cols - bw) - mi_col) * 0x20;
  xd->mi_row = mi_row;
  xd->mi_col = mi_col;
  xd->up_available = tile->mi_row_start < mi_row;
  uVar1 = xd->plane[1].subsampling_x;
  uVar2 = xd->plane[1].subsampling_y;
  xd->left_available = tile->mi_col_start < mi_col;
  xd->chroma_up_available = (_Bool)(xd->up_available & 1);
  xd->chroma_left_available = (_Bool)(xd->left_available & 1);
  if ((uVar1 != 0) && (bw < 2)) {
    xd->chroma_left_available = tile->mi_col_start < mi_col + -1;
  }
  if ((uVar2 != 0) && (bh < 2)) {
    xd->chroma_up_available = tile->mi_row_start < mi_row + -1;
  }
  if ((xd->up_available & 1U) == 0) {
    xd->above_mbmi = (MB_MODE_INFO *)0x0;
  }
  else {
    xd->above_mbmi = xd->mi[-xd->mi_stride];
  }
  if ((xd->left_available & 1U) == 0) {
    xd->left_mbmi = (MB_MODE_INFO *)0x0;
  }
  else {
    xd->left_mbmi = xd->mi[-1];
  }
  if (((((mi_row & 1U) != 0) || ((bh & 1U) == 0)) || (bVar4 = false, uVar2 == 0)) &&
     ((bVar4 = true, (mi_col & 1U) == 0 && (bVar4 = true, (bw & 1U) != 0)))) {
    bVar4 = uVar1 == 0;
  }
  xd->is_chroma_ref = bVar4;
  if (bVar4) {
    iVar3 = -(mi_row & uVar2) * xd->mi_stride - (mi_col & uVar1);
    if ((xd->chroma_up_available & 1U) == 0) {
      local_58 = (MB_MODE_INFO *)0x0;
    }
    else {
      local_58 = xd->mi[(long)iVar3 + (long)(int)(uVar1 - xd->mi_stride)];
    }
    xd->chroma_above_mbmi = local_58;
    if ((xd->chroma_left_available & 1U) == 0) {
      local_60 = (MB_MODE_INFO *)0x0;
    }
    else {
      local_60 = xd->mi[(long)iVar3 + (long)(int)(uVar2 * xd->mi_stride + -1)];
    }
    xd->chroma_left_mbmi = local_60;
  }
  xd->height = (uint8_t)bh;
  xd->width = (uint8_t)bw;
  xd->is_last_vertical_rect = false;
  if ((xd->width < xd->height) && ((mi_col + (uint)xd->width & xd->height - 1) == 0)) {
    xd->is_last_vertical_rect = true;
  }
  xd->is_first_horizontal_rect = false;
  if ((xd->height < xd->width) && ((mi_row & xd->width - 1) == 0)) {
    xd->is_first_horizontal_rect = true;
  }
  return;
}

Assistant:

static inline void set_mi_row_col(MACROBLOCKD *xd, const TileInfo *const tile,
                                  int mi_row, int bh, int mi_col, int bw,
                                  int mi_rows, int mi_cols) {
  xd->mb_to_top_edge = -GET_MV_SUBPEL(mi_row * MI_SIZE);
  xd->mb_to_bottom_edge = GET_MV_SUBPEL((mi_rows - bh - mi_row) * MI_SIZE);
  xd->mb_to_left_edge = -GET_MV_SUBPEL((mi_col * MI_SIZE));
  xd->mb_to_right_edge = GET_MV_SUBPEL((mi_cols - bw - mi_col) * MI_SIZE);

  xd->mi_row = mi_row;
  xd->mi_col = mi_col;

  // Are edges available for intra prediction?
  xd->up_available = (mi_row > tile->mi_row_start);

  const int ss_x = xd->plane[1].subsampling_x;
  const int ss_y = xd->plane[1].subsampling_y;

  xd->left_available = (mi_col > tile->mi_col_start);
  xd->chroma_up_available = xd->up_available;
  xd->chroma_left_available = xd->left_available;
  if (ss_x && bw < mi_size_wide[BLOCK_8X8])
    xd->chroma_left_available = (mi_col - 1) > tile->mi_col_start;
  if (ss_y && bh < mi_size_high[BLOCK_8X8])
    xd->chroma_up_available = (mi_row - 1) > tile->mi_row_start;
  if (xd->up_available) {
    xd->above_mbmi = xd->mi[-xd->mi_stride];
  } else {
    xd->above_mbmi = NULL;
  }

  if (xd->left_available) {
    xd->left_mbmi = xd->mi[-1];
  } else {
    xd->left_mbmi = NULL;
  }

  const int chroma_ref = ((mi_row & 0x01) || !(bh & 0x01) || !ss_y) &&
                         ((mi_col & 0x01) || !(bw & 0x01) || !ss_x);
  xd->is_chroma_ref = chroma_ref;
  if (chroma_ref) {
    // To help calculate the "above" and "left" chroma blocks, note that the
    // current block may cover multiple luma blocks (e.g., if partitioned into
    // 4x4 luma blocks).
    // First, find the top-left-most luma block covered by this chroma block
    MB_MODE_INFO **base_mi =
        &xd->mi[-(mi_row & ss_y) * xd->mi_stride - (mi_col & ss_x)];

    // Then, we consider the luma region covered by the left or above 4x4 chroma
    // prediction. We want to point to the chroma reference block in that
    // region, which is the bottom-right-most mi unit.
    // This leads to the following offsets:
    MB_MODE_INFO *chroma_above_mi =
        xd->chroma_up_available ? base_mi[-xd->mi_stride + ss_x] : NULL;
    xd->chroma_above_mbmi = chroma_above_mi;

    MB_MODE_INFO *chroma_left_mi =
        xd->chroma_left_available ? base_mi[ss_y * xd->mi_stride - 1] : NULL;
    xd->chroma_left_mbmi = chroma_left_mi;
  }

  xd->height = bh;
  xd->width = bw;

  xd->is_last_vertical_rect = 0;
  if (xd->width < xd->height) {
    if (!((mi_col + xd->width) & (xd->height - 1))) {
      xd->is_last_vertical_rect = 1;
    }
  }

  xd->is_first_horizontal_rect = 0;
  if (xd->width > xd->height)
    if (!(mi_row & (xd->width - 1))) xd->is_first_horizontal_rect = 1;
}